

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

real __thiscall
fasttext::Model::oneVsAll(Model *this,vector<int,_std::allocator<int>_> *targets,real lr)

{
  bool label;
  float fVar1;
  real rVar2;
  int32_t local_20;
  real local_1c;
  
  fVar1 = 0.0;
  local_20 = 0;
  local_1c = lr;
  while( true ) {
    if (this->osz_ <= local_20) break;
    label = utils::contains<int>(targets,&local_20);
    rVar2 = binaryLogistic(this,local_20,label,local_1c);
    local_20 = local_20 + 1;
    fVar1 = fVar1 + rVar2;
  }
  return fVar1;
}

Assistant:

real Model::oneVsAll(const std::vector<int32_t>& targets, real lr) {
	real loss = 0.0;
	for (int32_t i = 0; i < osz_; i++) {
		bool isMatch = utils::contains(targets, i);
		loss += binaryLogistic(i, isMatch, lr);
	}

	return loss;
}